

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

exr_result_t exr_set_longname_support(exr_context_t ctxt,int onoff)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  int *piVar3;
  exr_result_t eVar4;
  int in_ESI;
  char *in_RDI;
  int c;
  exr_attr_chlist_t *chs;
  exr_attribute_t *curattr;
  int a;
  exr_priv_part_t curp;
  int p;
  uint8_t newval;
  uint8_t oldval;
  exr_const_context_t in_stack_ffffffffffffffb0;
  int local_44;
  int local_2c;
  int local_1c;
  byte local_16;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    internal_exr_lock(in_stack_ffffffffffffffb0);
    if ((*in_RDI == '\x01') || (*in_RDI == '\x04')) {
      local_16 = 0x1f;
      if (in_ESI == 0) {
        in_RDI[1] = '\x01';
      }
      else {
        local_16 = 0xff;
        in_RDI[1] = '\x02';
      }
      if (local_16 < (byte)in_RDI[2]) {
        for (local_1c = 0; local_1c < *(int *)(in_RDI + 0xc4); local_1c = local_1c + 1) {
          puVar1 = *(undefined4 **)(*(long *)(in_RDI + 0x1d8) + (long)local_1c * 8);
          for (local_2c = 0; local_2c < (int)puVar1[2]; local_2c = local_2c + 1) {
            puVar2 = *(undefined8 **)(*(long *)(puVar1 + 4) + (long)local_2c * 8);
            if ((local_16 < *(byte *)(puVar2 + 2)) || (local_16 < *(byte *)((long)puVar2 + 0x11))) {
              internal_exr_unlock(in_stack_ffffffffffffffb0);
              eVar4 = (**(code **)(in_RDI + 0x48))
                                (in_RDI,0xc,
                                 "Part %d, attribute \'%s\' (type \'%s\') has a name too long for new longname setting (%d)"
                                 ,*puVar1,*puVar2,puVar2[1],local_16);
              return eVar4;
            }
            if (*(int *)((long)puVar2 + 0x14) == 3) {
              piVar3 = (int *)puVar2[3];
              for (local_44 = 0; local_44 < *piVar3; local_44 = local_44 + 1) {
                if ((int)(uint)local_16 < *(int *)(*(long *)(piVar3 + 2) + (long)local_44 * 0x20)) {
                  internal_exr_unlock(in_stack_ffffffffffffffb0);
                  eVar4 = (**(code **)(in_RDI + 0x48))
                                    (in_RDI,0xc,
                                     "Part %d, channel \'%s\' has a name too long for new longname setting (%d)"
                                     ,*puVar1,*(undefined8 *)
                                               (*(long *)(piVar3 + 2) + (long)local_44 * 0x20 + 8),
                                     local_16);
                  return eVar4;
                }
              }
            }
          }
        }
      }
      in_RDI[2] = local_16;
      internal_exr_unlock(in_stack_ffffffffffffffb0);
      local_4 = 0;
    }
    else {
      internal_exr_unlock(in_stack_ffffffffffffffb0);
      local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_set_longname_support (exr_context_t ctxt, int onoff)
{
    uint8_t oldval, newval;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
    internal_exr_lock (ctxt);

    if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));

    oldval = ctxt->max_name_length;
    newval = EXR_SHORTNAME_MAXLEN;
    if (onoff)
    {
        newval        = EXR_LONGNAME_MAXLEN;
        ctxt->version = 2;
    }
    else { ctxt->version = 1; }

    if (oldval > newval)
    {
        for (int p = 0; p < ctxt->num_parts; ++p)
        {
            exr_priv_part_t curp = ctxt->parts[p];
            for (int a = 0; a < curp->attributes.num_attributes; ++a)
            {
                exr_attribute_t* curattr = curp->attributes.entries[a];
                if (curattr->name_length > newval ||
                    curattr->type_name_length > newval)
                {
                    return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                        ctxt,
                        EXR_ERR_NAME_TOO_LONG,
                        "Part %d, attribute '%s' (type '%s') has a name too long for new longname setting (%d)",
                        curp->part_index,
                        curattr->name,
                        curattr->type_name,
                        (int) newval));
                }
                if (curattr->type == EXR_ATTR_CHLIST)
                {
                    exr_attr_chlist_t* chs = curattr->chlist;
                    for (int c = 0; c < chs->num_channels; ++c)
                    {
                        if (chs->entries[c].name.length > newval)
                        {
                            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                                ctxt,
                                EXR_ERR_NAME_TOO_LONG,
                                "Part %d, channel '%s' has a name too long for new longname setting (%d)",
                                curp->part_index,
                                chs->entries[c].name.str,
                                (int) newval));
                        }
                    }
                }
            }
        }
    }
    ctxt->max_name_length = newval;
    return EXR_UNLOCK_AND_RETURN (EXR_ERR_SUCCESS);
}